

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSphere.cpp
# Opt level: O3

void __thiscall dgSphere::dgSphere(dgSphere *this,dgMatrix *matrix,dgVector *dim)

{
  float fVar1;
  ulong uVar2;
  bool bVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  fVar1 = (matrix->m_front).super_dgTemplateVector<float>.m_y;
  fVar9 = (matrix->m_front).super_dgTemplateVector<float>.m_z;
  fVar10 = (matrix->m_front).super_dgTemplateVector<float>.m_w;
  fVar11 = (matrix->m_up).super_dgTemplateVector<float>.m_x;
  fVar12 = (matrix->m_up).super_dgTemplateVector<float>.m_y;
  fVar13 = (matrix->m_up).super_dgTemplateVector<float>.m_z;
  fVar14 = (matrix->m_up).super_dgTemplateVector<float>.m_w;
  fVar15 = (matrix->m_right).super_dgTemplateVector<float>.m_x;
  fVar16 = (matrix->m_right).super_dgTemplateVector<float>.m_y;
  fVar17 = (matrix->m_right).super_dgTemplateVector<float>.m_z;
  fVar18 = (matrix->m_right).super_dgTemplateVector<float>.m_w;
  fVar19 = (matrix->m_posit).super_dgTemplateVector<float>.m_x;
  fVar20 = (matrix->m_posit).super_dgTemplateVector<float>.m_y;
  fVar21 = (matrix->m_posit).super_dgTemplateVector<float>.m_z;
  fVar22 = (matrix->m_posit).super_dgTemplateVector<float>.m_w;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_x =
       (matrix->m_front).super_dgTemplateVector<float>.m_x;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_y = fVar1;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_z = fVar9;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_w = fVar10;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_x = fVar11;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y = fVar12;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z = fVar13;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_w = fVar14;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_x = fVar15;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_y = fVar16;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_z = fVar17;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_w = fVar18;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_x = fVar19;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_y = fVar20;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_z = fVar21;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_w = fVar22;
  uVar2._0_4_ = (dim->super_dgTemplateVector<float>).m_y;
  uVar2._4_4_ = (dim->super_dgTemplateVector<float>).m_z;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar2;
  fVar1 = (dim->super_dgTemplateVector<float>).m_x;
  auVar23 = vmovshdup_avx(auVar27);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)((float)(undefined4)uVar2 * (float)(undefined4)uVar2)),
                           ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
  auVar23 = vfmadd213ss_fma(auVar23,auVar23,auVar6);
  auVar6 = vsqrtss_avx(auVar23,auVar23);
  auVar26 = ZEXT416((uint)fVar1);
  auVar23 = vpermi2ps_avx512vl(_DAT_009e2030,auVar27,auVar26);
  auVar23 = vinsertps_avx(auVar23,auVar6,0x30);
  auVar24._8_4_ = 0x7fffffff;
  auVar24._0_8_ = 0x7fffffff7fffffff;
  auVar24._12_4_ = 0x7fffffff;
  auVar24 = vandps_avx512vl(auVar23,auVar24);
  auVar23._8_4_ = 0x7f7fffff;
  auVar23._0_8_ = 0x7f7fffff7f7fffff;
  auVar23._12_4_ = 0x7f7fffff;
  uVar5 = vpcmpgtd_avx512vl(auVar24,auVar23);
  if ((uVar5 & 0xf) == 0) {
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar23 = vxorps_avx512vl(auVar27,auVar7);
    uVar5 = vcmpps_avx512vl(auVar23,auVar27,2);
    bVar3 = (bool)((byte)uVar5 & 1);
    auVar25._0_4_ = (float)((uint)bVar3 * (undefined4)uVar2 | (uint)!bVar3 * auVar23._0_4_);
    bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
    auVar25._4_4_ = (uint)bVar3 * uVar2._4_4_ | (uint)!bVar3 * auVar23._4_4_;
    auVar25._8_4_ = (uint)!(bool)((byte)(uVar5 >> 2) & 1) * auVar23._8_4_;
    auVar25._12_4_ = (uint)!(bool)((byte)(uVar5 >> 3) & 1) * auVar23._12_4_;
    if (!NAN(auVar25._0_4_)) {
      auVar23 = vmovshdup_avx(auVar25);
      if (!NAN(auVar23._0_4_) && !NAN(auVar6._0_4_)) {
        auVar8._8_4_ = 0x80000000;
        auVar8._0_8_ = 0x8000000080000000;
        auVar8._12_4_ = 0x80000000;
        auVar23 = vxorps_avx512vl(auVar26,auVar8);
        uVar4 = vcmpss_avx512f(auVar23,auVar26,2);
        bVar3 = (bool)((byte)uVar4 & 1);
        (this->m_size).super_dgTemplateVector<float>.m_x =
             (float)((uint)bVar3 * (int)fVar1 + (uint)!bVar3 * auVar23._0_4_);
        uVar4 = vmovlps_avx(auVar25);
        (this->m_size).super_dgTemplateVector<float>.m_y = (float)(int)uVar4;
        (this->m_size).super_dgTemplateVector<float>.m_z = (float)(int)((ulong)uVar4 >> 0x20);
        (this->m_size).super_dgTemplateVector<float>.m_w = auVar6._0_4_;
        return;
      }
    }
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
}

Assistant:

dgSphere::dgSphere(const dgMatrix &matrix, const dgVector& dim)
	:dgMatrix(matrix)
{
   SetDimensions (dim.m_x, dim.m_y, dim.m_z);
//   HACD_ASSERT (0);
//	planeTest = FrontTest;
}